

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke.cc
# Opt level: O3

int p256_decap(EVP_HPKE_KEY *key,uint8_t *out_shared_secret,size_t *out_shared_secret_len,
              uint8_t *enc,size_t enc_len)

{
  uint16_t kem_id;
  int iVar1;
  EVP_MD *hkdf_md;
  uint8_t dh [32];
  uint8_t kem_context [130];
  size_t in_stack_ffffffffffffff20;
  uint8_t local_d8 [32];
  undefined1 local_b8 [65];
  undefined1 local_77 [71];
  
  if ((enc_len == 0x41) && (iVar1 = p256(local_d8,key->private_key,enc), iVar1 != 0)) {
    memcpy(local_b8,enc,0x41);
    memcpy(local_77,key->public_key,0x41);
    kem_id = key->kem->id;
    hkdf_md = EVP_sha256();
    iVar1 = dhkem_extract_and_expand
                      (kem_id,(EVP_MD *)hkdf_md,out_shared_secret,(size_t)local_d8,&DAT_00000020,
                       (size_t)local_b8,(uint8_t *)0x82,in_stack_ffffffffffffff20);
    if (iVar1 != 0) {
      *out_shared_secret_len = 0x20;
      return 1;
    }
    return 0;
  }
  ERR_put_error(6,0,0x86,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke.cc"
                ,0x1f0);
  return 0;
}

Assistant:

static int p256_decap(const EVP_HPKE_KEY *key, uint8_t *out_shared_secret,
                      size_t *out_shared_secret_len, const uint8_t *enc,
                      size_t enc_len) {
  uint8_t dh[P256_SHARED_KEY_LEN];
  if (enc_len != P256_PUBLIC_VALUE_LEN ||  //
      !p256(dh, key->private_key, enc)) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_INVALID_PEER_KEY);
    return 0;
  }

  uint8_t kem_context[2 * P256_PUBLIC_VALUE_LEN];
  OPENSSL_memcpy(kem_context, enc, P256_PUBLIC_VALUE_LEN);
  OPENSSL_memcpy(kem_context + P256_PUBLIC_VALUE_LEN, key->public_key,
                 P256_PUBLIC_VALUE_LEN);
  if (!dhkem_extract_and_expand(key->kem->id, EVP_sha256(), out_shared_secret,
                                SHA256_DIGEST_LENGTH, dh, sizeof(dh),
                                kem_context, sizeof(kem_context))) {
    return 0;
  }

  *out_shared_secret_len = SHA256_DIGEST_LENGTH;
  return 1;
}